

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

void __thiscall TxConfirmStats::resizeInMemoryCounters(TxConfirmStats *this,size_t newbuckets)

{
  long lVar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_01;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  size_type in_RDI;
  long in_FS_OFFSET;
  uint i;
  TxConfirmStats *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(in_RDI + 0x80);
  GetMaxConfirms(in_stack_ffffffffffffffc8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_RSI,CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  uVar3 = 0;
  while( true ) {
    this_01 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)(ulong)uVar3;
    pvVar2 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::size(this_01);
    if (pvVar2 <= this_01) break;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](this_00,in_RDI);
    std::vector<int,_std::allocator<int>_>::resize(in_RSI,CONCAT44(uVar3,in_stack_ffffffffffffffe0))
    ;
    uVar3 = uVar3 + 1;
  }
  std::vector<int,_std::allocator<int>_>::resize(in_RSI,CONCAT44(uVar3,in_stack_ffffffffffffffe0));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::resizeInMemoryCounters(size_t newbuckets) {
    // newbuckets must be passed in because the buckets referred to during Read have not been updated yet.
    unconfTxs.resize(GetMaxConfirms());
    for (unsigned int i = 0; i < unconfTxs.size(); i++) {
        unconfTxs[i].resize(newbuckets);
    }
    oldUnconfTxs.resize(newbuckets);
}